

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O3

void cmFortranParser_RuleElse(cmFortranParser *parser)

{
  _Elt_pointer pbVar1;
  size_t sVar2;
  
  if (1 < parser->InPPFalseBranch) {
    return;
  }
  pbVar1 = (parser->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pbVar1 != (parser->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    if (pbVar1 == (parser->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pbVar1 = (parser->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
    }
    sVar2 = 1;
    if (pbVar1[-1] != false) goto LAB_00175de8;
  }
  sVar2 = 0;
LAB_00175de8:
  parser->InPPFalseBranch = sVar2;
  return;
}

Assistant:

void cmFortranParser_RuleElse(cmFortranParser* parser)
{
  // if the parent branch is false do nothing!
  if (parser->InPPFalseBranch > 1) {
    return;
  }

  // parser->InPPFalseBranch is either 0 or 1.  We change it depending on
  // parser->SkipToEnd.top()
  if (!parser->SkipToEnd.empty() && parser->SkipToEnd.top()) {
    parser->InPPFalseBranch = 1;
  } else {
    parser->InPPFalseBranch = 0;
  }
}